

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ICUTransService.cpp
# Opt level: O0

void __thiscall xercesc_4_0::ICUTransService::~ICUTransService(ICUTransService *this)

{
  void *in_RSI;
  ICUTransService *this_local;
  
  ~ICUTransService(this);
  XMemory::operator_delete((XMemory *)this,in_RSI);
  return;
}

Assistant:

ICUTransService::~ICUTransService()
{
    /*
     * commented out the following clean up code
     * in case users use ICU outside of the parser
     * if we clean up here, users' code may crash
     *
    #if (U_ICU_VERSION_MAJOR_NUM >= 2)
        // release all lazily allocated data
        u_cleanup();
    #endif
    */
}